

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_linal_u_mul(double *res,double *u,double *v,size_t n,size_t m)

{
  ulong uVar1;
  double *pdVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  double dVar8;
  double *local_38;
  
  if (m != 0) {
    uVar4 = 0;
    local_38 = v;
    do {
      if (n != 0) {
        sVar6 = 0;
        lVar7 = 0;
        pdVar2 = local_38;
        uVar5 = uVar4;
        do {
          dVar8 = u[lVar7] * v[uVar5];
          res[uVar5] = dVar8;
          sVar3 = m;
          uVar1 = uVar5 + m;
          while (lVar7 = lVar7 + 1, uVar1 < m * n) {
            dVar8 = dVar8 + u[lVar7] * pdVar2[sVar3];
            res[uVar5] = dVar8;
            sVar3 = sVar3 + m;
            uVar1 = uVar5 + sVar3;
          }
          sVar6 = sVar6 + 1;
          pdVar2 = pdVar2 + m;
          uVar5 = uVar5 + m;
        } while (sVar6 != n);
      }
      uVar4 = uVar4 + 1;
      local_38 = local_38 + 1;
    } while (uVar4 != m);
  }
  return;
}

Assistant:

void fsnav_linal_u_mul(double* res, double* u, double* v, const size_t n, const size_t m)
{
	size_t i, j, k, p, p0, mn;

	mn = m*n;
	for (j = 0; j < m; j++) {
		for (i = 0, k = 0, p0 = j; i < n; i++, p0 += m) {
			res[p0] = u[k]*v[p0];
			for (p = p0+m, k++; p < mn; p += m, k++)
				res[p0] += u[k]*v[p];
		}
	}
}